

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_stream.cpp
# Opt level: O1

void __thiscall libtorrent::http_stream::connected(http_stream *this,error_code *e,handler_type *h)

{
  tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
  *ptVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  pointer pcVar4;
  size_type sVar5;
  pointer pcVar6;
  _Manager_type p_Var7;
  bool bVar8;
  long *plVar9;
  long *plVar10;
  size_type *psVar11;
  offset_in__Undefined_class_to_subr *poVar12;
  endpoint *ep;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string endpoint;
  _Bind<void_(libtorrent::http_stream::*(libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>))(const_boost::system::error_code_&,_std::function<void_(const_boost::system::error_code_&)>_&)>
  local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  back_insert_iterator<std::vector<char,_std::allocator<char>_>_> local_b8;
  long *local_b0 [2];
  long local_a0 [2];
  string local_90;
  string local_70;
  string local_50;
  
  bVar8 = proxy_base::handle_error(&this->super_proxy_base,e,h);
  if (!bVar8) {
    if (this->m_no_connect == true) {
      pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      pcVar4 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (pcVar3 != (pointer)0x0) {
        operator_delete(pcVar3,(long)pcVar4 - (long)pcVar3);
      }
      if ((h->super__Function_base)._M_manager != (_Manager_type)0x0) {
        (*h->_M_invoker)((_Any_data *)h,e);
        return;
      }
      std::__throw_bad_function_call();
    }
    local_b8.container = &this->m_buffer;
    print_endpoint_abi_cxx11_
              (&local_50,(libtorrent *)&(this->super_proxy_base).m_remote_endpoint,ep);
    std::operator+(&local_d8,"CONNECT ",&local_50);
    plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
    ptVar1 = &local_110._M_bound_args;
    plVar10 = plVar9 + 2;
    if ((tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
         *)*plVar9 ==
        (tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
         *)plVar10) {
      local_110._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer = *plVar10;
      local_110._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._8_8_ = plVar9[3];
      local_110._M_f = (offset_in_http_stream_to_subr)ptVar1;
    }
    else {
      local_110._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer = *plVar10;
      local_110._M_f = (offset_in_http_stream_to_subr)*plVar9;
    }
    local_110._8_8_ = plVar9[1];
    *plVar9 = (long)plVar10;
    plVar9[1] = 0;
    *(undefined1 *)(plVar9 + 2) = 0;
    detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((string *)&local_110,&local_b8);
    if ((tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
         *)local_110._M_f != ptVar1) {
      operator_delete((void *)local_110._M_f,
                      local_110._M_bound_args.
                      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
                      .
                      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
                      .
                      super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>
                      .
                      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>
                      ._M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer + 1)
      ;
    }
    paVar2 = &local_d8.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != paVar2) {
      operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
    }
    sVar5 = (this->m_user)._M_string_length;
    if (sVar5 != 0) {
      pcVar6 = (this->m_user)._M_dataplus._M_p;
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char*>((string *)local_b0,pcVar6,pcVar6 + sVar5);
      std::__cxx11::string::append((char *)local_b0);
      plVar9 = (long *)std::__cxx11::string::_M_append
                                 ((char *)local_b0,(ulong)(this->m_password)._M_dataplus._M_p);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90.field_2._8_8_ = plVar9[3];
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      }
      else {
        local_90.field_2._M_allocated_capacity = *psVar11;
        local_90._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_90._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      base64encode(&local_70,&local_90);
      plVar9 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x37c052);
      psVar11 = (size_type *)(plVar9 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar9 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar11) {
        local_d8.field_2._M_allocated_capacity = *psVar11;
        local_d8.field_2._8_8_ = plVar9[3];
        local_d8._M_dataplus._M_p = (pointer)paVar2;
      }
      else {
        local_d8.field_2._M_allocated_capacity = *psVar11;
        local_d8._M_dataplus._M_p = (pointer)*plVar9;
      }
      local_d8._M_string_length = plVar9[1];
      *plVar9 = (long)psVar11;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
      poVar12 = (offset_in__Undefined_class_to_subr *)(plVar9 + 2);
      if ((tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
           *)*plVar9 ==
          (tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
           *)poVar12) {
        local_110._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer = *poVar12;
        local_110._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_functor._8_8_ = plVar9[3];
        local_110._M_f = (offset_in_http_stream_to_subr)ptVar1;
      }
      else {
        local_110._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_functor._M_unused._M_member_pointer = *poVar12;
        local_110._M_f = (offset_in_http_stream_to_subr)*plVar9;
      }
      local_110._8_8_ = plVar9[1];
      *plVar9 = (long)poVar12;
      plVar9[1] = 0;
      *(undefined1 *)(plVar9 + 2) = 0;
      detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
                ((string *)&local_110,&local_b8);
      if ((tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
           *)local_110._M_f != ptVar1) {
        operator_delete((void *)local_110._M_f,
                        (ulong)(local_110._M_bound_args.
                                super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
                                .
                                super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
                                .
                                super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>
                                .
                                super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>
                                ._M_head_impl.super__Function_base._M_functor._M_unused.
                                _M_member_pointer + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != paVar2) {
        operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      if (local_b0[0] != local_a0) {
        operator_delete(local_b0[0],local_a0[0] + 1);
      }
    }
    local_110._M_f = (offset_in_http_stream_to_subr)ptVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"\r\n","");
    detail::write_string<std::back_insert_iterator<std::vector<char,std::allocator<char>>>>
              ((string *)&local_110,&local_b8);
    if ((tuple<libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
         *)local_110._M_f != ptVar1) {
      operator_delete((void *)local_110._M_f,
                      (ulong)(local_110._M_bound_args.
                              super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
                              .
                              super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
                              .
                              super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>
                              .
                              super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>
                              ._M_head_impl.super__Function_base._M_functor._M_unused.
                              _M_member_pointer + 1));
    }
    pcVar3 = (this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_d8._M_string_length =
         (long)(this->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_finish - (long)pcVar3;
    local_d8._M_dataplus._M_p = (pointer)0x0;
    if (local_d8._M_string_length != 0) {
      local_d8._M_dataplus._M_p = pcVar3;
    }
    local_110._M_f = (offset_in_http_stream_to_subr)handshake1;
    local_110._8_8_ = 0;
    local_110._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
    local_110._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_functor._8_8_ = 0;
    local_110._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl.super__Function_base._M_manager = (_Manager_type)0x0;
    local_110._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .
    super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
    super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
    _M_head_impl._M_invoker = h->_M_invoker;
    p_Var7 = (h->super__Function_base)._M_manager;
    if (p_Var7 != (_Manager_type)0x0) {
      local_110._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._M_unused._0_8_ =
           (undefined8)*(undefined8 *)&(h->super__Function_base)._M_functor;
      local_110._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_functor._8_8_ =
           *(undefined8 *)((long)&(h->super__Function_base)._M_functor + 8);
      (h->super__Function_base)._M_manager = (_Manager_type)0x0;
      h->_M_invoker = (_Invoker_type)0x0;
      local_110._M_bound_args.
      super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .
      super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
      .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
      super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
      _M_head_impl.super__Function_base._M_manager = p_Var7;
    }
    local_110._M_bound_args.
    super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
    .super__Head_base<0UL,_libtorrent::http_stream_*,_false>._M_head_impl = this;
    local_70._M_dataplus._M_p = (pointer)this;
    boost::asio::detail::
    initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
    ::operator()((initiate_async_write_buffer_sequence<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>
                  *)&local_70,&local_110,(mutable_buffers_1 *)&local_d8,(transfer_all_t *)&local_90)
    ;
    if (local_110._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_110._M_bound_args.
        super__Tuple_impl<0UL,_libtorrent::http_stream_*,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .
        super__Tuple_impl<1UL,_std::_Placeholder<1>,_std::function<void_(const_boost::system::error_code_&)>_>
        .super__Tuple_impl<2UL,_std::function<void_(const_boost::system::error_code_&)>_>.
        super__Head_base<2UL,_std::function<void_(const_boost::system::error_code_&)>,_false>.
        _M_head_impl.super__Function_base._M_manager)
                ((_Any_data *)ptVar1,(_Any_data *)ptVar1,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void http_stream::connected(error_code const& e, handler_type& h)
	{
		if (handle_error(e, h)) return;

		using namespace libtorrent::detail;

		if (m_no_connect)
		{
			std::vector<char>().swap(m_buffer);
			h(e);
			return;
		}

		// send CONNECT
		std::back_insert_iterator<std::vector<char>> p(m_buffer);
		std::string const endpoint = print_endpoint(m_remote_endpoint);
		write_string("CONNECT " + endpoint + " HTTP/1.0\r\n", p);
		if (!m_user.empty())
		{
			write_string("Proxy-Authorization: Basic " + base64encode(
				m_user + ":" + m_password) + "\r\n", p);
		}
		write_string("\r\n", p);
		async_write(m_sock, boost::asio::buffer(m_buffer)
			, std::bind(&http_stream::handshake1, this, _1, std::move(h)));
	}